

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O1

rgb_pixel __thiscall dlib::drawable_window::background_color(drawable_window *this)

{
  rgb_pixel rVar1;
  auto_mutex M;
  auto_mutex local_38;
  
  local_38.r = (this->super_base_window).wm;
  local_38.m = (mutex *)0x0;
  local_38.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_38.r,1);
  rVar1 = this->bg_color;
  auto_mutex::unlock(&local_38);
  return rVar1;
}

Assistant:

rgb_pixel drawable_window::
    background_color (
    ) const
    {
        auto_mutex M(wm);
        return bg_color;
    }